

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_fullscreen.cxx
# Opt level: O2

void __thiscall Fl_Window::fullscreen_screens(Fl_Window *this,int top,int bottom,int left,int right)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  unsigned_long unaff_RBX;
  Window WVar4;
  int iVar5;
  int iVar6;
  
  fullscreen_screen_right = -1;
  fullscreen_screen_bottom = fullscreen_screen_right;
  fullscreen_screen_top = fullscreen_screen_right;
  fullscreen_screen_left = fullscreen_screen_right;
  if (-1 < (bottom | top | left | right)) {
    fullscreen_screen_right = right;
    fullscreen_screen_bottom = bottom;
    fullscreen_screen_top = top;
    fullscreen_screen_left = left;
  }
  if ((this->i != (Fl_X *)0x0) && (((this->super_Fl_Group).super_Fl_Widget.flags_ & 0x40000) != 0))
  {
    iVar2 = Fl_X::ewmh_supported();
    if (iVar2 != 0) {
      iVar2 = fullscreen_screen_top;
      iVar3 = fullscreen_screen_bottom;
      iVar5 = fullscreen_screen_left;
      iVar6 = fullscreen_screen_right;
      if ((fullscreen_screen_top | fullscreen_screen_bottom | fullscreen_screen_left |
          fullscreen_screen_right) < 0) {
        iVar2 = Fl::screen_num((this->super_Fl_Group).super_Fl_Widget.x_,
                               (this->super_Fl_Group).super_Fl_Widget.y_,
                               (this->super_Fl_Group).super_Fl_Widget.w_,
                               (this->super_Fl_Group).super_Fl_Widget.h_);
        iVar3 = iVar2;
        iVar5 = iVar2;
        iVar6 = iVar2;
      }
      if (this->i == (Fl_X *)0x0) {
        WVar4 = 0;
      }
      else {
        WVar4 = this->i->xid;
      }
      send_wm_event(WVar4,fl_NET_WM_FULLSCREEN_MONITORS,(long)iVar2,(long)iVar3,(long)iVar5,
                    (long)iVar6,unaff_RBX);
      if (this->i == (Fl_X *)0x0) {
        WVar4 = 0;
      }
      else {
        WVar4 = this->i->xid;
      }
      send_wm_state_event(WVar4,1,fl_NET_WM_STATE_FULLSCREEN);
      return;
    }
    pbVar1 = (byte *)((long)&(this->super_Fl_Group).super_Fl_Widget.flags_ + 2);
    *pbVar1 = *pbVar1 | 4;
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])(this);
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this);
    if (this->i == (Fl_X *)0x0) {
      WVar4 = 0;
    }
    else {
      WVar4 = this->i->xid;
    }
    XGrabKeyboard(fl_display,WVar4,1,1,1,fl_event_time);
    Fl::handle(0x19,this);
    return;
  }
  return;
}

Assistant:

void Fl_Window::fullscreen_screens(int top, int bottom, int left, int right) {
  if ((top < 0) || (bottom < 0) || (left < 0) || (right < 0)) {
    fullscreen_screen_top = -1;
    fullscreen_screen_bottom = -1;
    fullscreen_screen_left = -1;
    fullscreen_screen_right = -1;
  } else {
    fullscreen_screen_top = top;
    fullscreen_screen_bottom = bottom;
    fullscreen_screen_left = left;
    fullscreen_screen_right = right;
  }

  if (shown() && fullscreen_active())
    fullscreen_x();
}